

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_zTXt(LodePNGInfo *info,LodePNGDecoderSettings *decoder,uchar *data,size_t chunkLength
                   )

{
  bool bVar1;
  size_t local_78;
  size_t size;
  uchar *str;
  char *key;
  uint string2_begin;
  uint length;
  LodePNGDecompressSettings zlibsettings;
  uint error;
  size_t chunkLength_local;
  uchar *data_local;
  LodePNGDecoderSettings *decoder_local;
  LodePNGInfo *info_local;
  
  zlibsettings.custom_context._4_4_ = 0;
  memcpy(&string2_begin,decoder,0x28);
  str = (uchar *)0x0;
  size = 0;
  local_78 = 0;
  if (zlibsettings.custom_context._4_4_ == 0) {
    key._4_4_ = 0;
    while( true ) {
      bVar1 = false;
      if (key._4_4_ < chunkLength) {
        bVar1 = data[key._4_4_] != '\0';
      }
      if (!bVar1) break;
      key._4_4_ = key._4_4_ + 1;
    }
    if (key._4_4_ + 2 < chunkLength) {
      if ((key._4_4_ == 0) || (0x4f < key._4_4_)) {
        zlibsettings.custom_context._4_4_ = 0x59;
      }
      else {
        str = (uchar *)lodepng_malloc((ulong)(key._4_4_ + 1));
        if (str == (uchar *)0x0) {
          zlibsettings.custom_context._4_4_ = 0x53;
        }
        else {
          lodepng_memcpy(str,data,(ulong)key._4_4_);
          str[key._4_4_] = '\0';
          if (data[key._4_4_ + 1] == '\0') {
            key._0_4_ = key._4_4_ + 2;
            if (chunkLength < (uint)key) {
              zlibsettings.custom_context._4_4_ = 0x4b;
            }
            else {
              key._4_4_ = (int)chunkLength - (uint)key;
              zlibsettings._0_8_ = decoder->max_text_size;
              zlibsettings.custom_context._4_4_ =
                   zlib_decompress((uchar **)&size,&local_78,0,data + (uint)key,(ulong)key._4_4_,
                                   (LodePNGDecompressSettings *)&string2_begin);
              if ((zlibsettings.custom_context._4_4_ != 0) && ((ulong)zlibsettings._0_8_ < local_78)
                 ) {
                zlibsettings.custom_context._4_4_ = 0x70;
              }
              if (zlibsettings.custom_context._4_4_ == 0) {
                zlibsettings.custom_context._4_4_ =
                     lodepng_add_text_sized(info,(char *)str,(char *)size,local_78);
              }
            }
          }
          else {
            zlibsettings.custom_context._4_4_ = 0x48;
          }
        }
      }
    }
    else {
      zlibsettings.custom_context._4_4_ = 0x4b;
    }
  }
  lodepng_free(str);
  lodepng_free((void *)size);
  return zlibsettings.custom_context._4_4_;
}

Assistant:

static unsigned readChunk_zTXt(LodePNGInfo* info, const LodePNGDecoderSettings* decoder,
                               const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;

  /*copy the object to change parameters in it*/
  LodePNGDecompressSettings zlibsettings = decoder->zlibsettings;

  unsigned length, string2_begin;
  char *key = 0;
  unsigned char* str = 0;
  size_t size = 0;

  while(!error) /*not really a while loop, only used to break on error*/ {
    for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
    if(length + 2 >= chunkLength) CERROR_BREAK(error, 75); /*no null termination, corrupt?*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(key, data, length);
    key[length] = 0;

    if(data[length + 1] != 0) CERROR_BREAK(error, 72); /*the 0 byte indicating compression must be 0*/

    string2_begin = length + 2;
    if(string2_begin > chunkLength) CERROR_BREAK(error, 75); /*no null termination, corrupt?*/

    length = (unsigned)chunkLength - string2_begin;
    zlibsettings.max_output_size = decoder->max_text_size;
    /*will fail if zlib error, e.g. if length is too small*/
    error = zlib_decompress(&str, &size, 0, &data[string2_begin],
                            length, &zlibsettings);
    /*error: compressed text larger than  decoder->max_text_size*/
    if(error && size > zlibsettings.max_output_size) error = 112;
    if(error) break;
    error = lodepng_add_text_sized(info, key, (char*)str, size);
    break;
  }

  lodepng_free(key);
  lodepng_free(str);

  return error;
}